

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetCurrentFont(ImFont *font)

{
  ImGuiContext *pIVar1;
  float fVar2;
  float fVar3;
  
  pIVar1 = GImGui;
  GImGui->Font = font;
  fVar2 = (pIVar1->IO).FontGlobalScale * font->FontSize * font->Scale;
  fVar3 = 1.0;
  if (1.0 <= fVar2) {
    fVar3 = fVar2;
  }
  pIVar1->FontBaseSize = fVar3;
  if (pIVar1->CurrentWindow == (ImGuiWindow *)0x0) {
    fVar3 = 0.0;
  }
  else {
    fVar3 = ImGuiWindow::CalcFontSize(pIVar1->CurrentWindow);
    font = pIVar1->Font;
  }
  pIVar1->FontSize = fVar3;
  (pIVar1->DrawListSharedData).TexUvWhitePixel = font->ContainerAtlas->TexUvWhitePixel;
  (pIVar1->DrawListSharedData).Font = font;
  (pIVar1->DrawListSharedData).FontSize = fVar3;
  return;
}

Assistant:

void ImGui::SetCurrentFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(font && font->IsLoaded());    // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(font->Scale > 0.0f);
    g.Font = font;
    g.FontBaseSize = ImMax(1.0f, g.IO.FontGlobalScale * g.Font->FontSize * g.Font->Scale);
    g.FontSize = g.CurrentWindow ? g.CurrentWindow->CalcFontSize() : 0.0f;

    ImFontAtlas* atlas = g.Font->ContainerAtlas;
    g.DrawListSharedData.TexUvWhitePixel = atlas->TexUvWhitePixel;
    g.DrawListSharedData.Font = g.Font;
    g.DrawListSharedData.FontSize = g.FontSize;
}